

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::setState
          (VertexArrayObjectTest *this,VertexArrayState *state)

{
  GLint size;
  GLenum GVar1;
  pointer pAVar2;
  int iVar3;
  GLuint index;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  glwBindBuffer(0x8893,(this->m_buffers).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[state->elementArrayBuffer]);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x224);
  pAVar2 = (state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(state->attributes).
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 2) *
          0x38e38e39) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      glwBindBuffer(0x8892,(this->m_buffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [*(int *)((long)&pAVar2->bufferNdx + lVar6)]);
      GVar1 = glwGetError();
      glu::checkError(GVar1,
                      "glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0x228);
      index = (GLuint)lVar4;
      if ((&((state->attributes).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start)->enabled)[lVar6] == '\0') {
        glwDisableVertexAttribArray(index);
        GVar1 = glwGetError();
        pcVar5 = "glDisableVertexAttribArray(attribNdx)";
        iVar3 = 0x22c;
      }
      else {
        glwEnableVertexAttribArray(index);
        GVar1 = glwGetError();
        pcVar5 = "glEnableVertexAttribArray(attribNdx)";
        iVar3 = 0x22a;
      }
      glu::checkError(GVar1,pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,iVar3);
      pAVar2 = (state->attributes).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      size = *(GLint *)((long)&pAVar2->size + lVar6);
      GVar1 = *(GLenum *)((long)&pAVar2->type + lVar6);
      if ((&pAVar2->integer)[lVar6] == '\0') {
        glwVertexAttribPointer
                  (index,size,GVar1,(&pAVar2->normalized)[lVar6],
                   *(GLsizei *)((long)&pAVar2->stride + lVar6),
                   (void *)(long)*(int *)((long)&pAVar2->offset + lVar6));
        GVar1 = glwGetError();
        pcVar5 = 
        "glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
        ;
        iVar3 = 0x231;
      }
      else {
        glwVertexAttribIPointer
                  (index,size,GVar1,*(GLsizei *)((long)&pAVar2->stride + lVar6),
                   (void *)(long)*(int *)((long)&pAVar2->offset + lVar6));
        GVar1 = glwGetError();
        pcVar5 = 
        "glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
        ;
        iVar3 = 0x22f;
      }
      glu::checkError(GVar1,pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,iVar3);
      glwVertexAttribDivisor
                (index,*(GLuint *)
                        ((long)&((state->attributes).
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->divisor + lVar6));
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0x233);
      lVar4 = lVar4 + 1;
      pAVar2 = (state->attributes).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x24;
    } while (lVar4 < (int)((ulong)((long)(state->attributes).
                                         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2)
                          >> 2) * 0x38e38e39);
  }
  return;
}

Assistant:

void VertexArrayObjectTest::setState (const VertexArrayState& state)
{
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer]));

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx]));
		if (state.attributes[attribNdx].enabled)
			GLU_CHECK_CALL(glEnableVertexAttribArray(attribNdx));
		else
			GLU_CHECK_CALL(glDisableVertexAttribArray(attribNdx));

		if (state.attributes[attribNdx].integer)
			GLU_CHECK_CALL(glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));
		else
			GLU_CHECK_CALL(glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));

		GLU_CHECK_CALL(glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor));
	}
}